

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_vv10.c
# Opt level: O0

void lc_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  xc_func_type *p_00;
  double *ext_params_00;
  xc_func_type *p_01;
  char *name;
  double C;
  double b;
  double omega;
  double beta;
  double alpha;
  
  p_00 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,0);
  ext_params_00 = (double *)get_ext_param(in_RDI,in_RSI,1);
  get_ext_param(in_RDI,in_RSI,2);
  p_01 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,3);
  name = (char *)get_ext_param(in_RDI,in_RSI,4);
  *in_RDI->mix_coef = -(double)p_01;
  xc_func_set_ext_params_name(p_01,name,(double)p_00);
  set_ext_params_cam(p_00,ext_params_00);
  in_RDI->nlc_b = (double)p_00;
  in_RDI->nlc_C = (double)ext_params_00;
  return;
}

Assistant:

static void
lc_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega, b, C;

  assert(p != NULL);

  b     = get_ext_param(p, ext_params, 0);
  C     = get_ext_param(p, ext_params, 1);
  alpha = get_ext_param(p, ext_params, 2);
  beta  = get_ext_param(p, ext_params, 3);
  omega = get_ext_param(p, ext_params, 4);

  /* DFT part */
  p->mix_coef[0] = -beta;
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  /* Set the hybrid flags */
  set_ext_params_cam(p, ext_params);

  /* Non-local correlation part */
  p->nlc_b = b;
  p->nlc_C = C;
}